

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O0

int WebPGetInfo(uint8_t *data,size_t data_size,int *width,int *height)

{
  VP8StatusCode VVar1;
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  WebPBitstreamFeatures features;
  undefined4 local_50;
  undefined4 local_4c;
  WebPBitstreamFeatures *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  uint8_t *in_stack_ffffffffffffffc8;
  undefined4 local_4;
  
  VVar1 = GetFeatures(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8)
  ;
  if (VVar1 == VP8_STATUS_OK) {
    if (in_RDX != (undefined4 *)0x0) {
      *in_RDX = local_50;
    }
    if (in_RCX != (undefined4 *)0x0) {
      *in_RCX = local_4c;
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int WebPGetInfo(const uint8_t* data, size_t data_size,
                int* width, int* height) {
  WebPBitstreamFeatures features;

  if (GetFeatures(data, data_size, &features) != VP8_STATUS_OK) {
    return 0;
  }

  if (width != NULL) {
    *width  = features.width;
  }
  if (height != NULL) {
    *height = features.height;
  }

  return 1;
}